

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retire_cid.c
# Opt level: O3

void quicly_retire_cid_push(quicly_retire_cid_set_t *set,uint64_t sequence)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = set->_num_pending;
  if (sVar1 != 0) {
    if (sVar1 == 8) {
      return;
    }
    sVar2 = 0;
    do {
      if (set->sequences[sVar2] == sequence) {
        return;
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
  }
  set->sequences[sVar1] = sequence;
  set->_num_pending = set->_num_pending + 1;
  return;
}

Assistant:

void quicly_retire_cid_push(quicly_retire_cid_set_t *set, uint64_t sequence)
{
    if (set->_num_pending == PTLS_ELEMENTSOF(set->sequences)) {
        /* in case we don't find an empty slot, we'll just drop this sequence (never send RETIRE_CONNECTION_ID frame) */
        return;
    }

    for (size_t i = 0; i < set->_num_pending; i++) {
        if (set->sequences[i] == sequence) {
            /* already scheduled */
            return;
        }
    }

    set->sequences[set->_num_pending] = sequence;
    set->_num_pending++;
}